

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QNetworkAddressEntry>>
          (QtPrivate *this,QDebug debug,char *which,QList<QNetworkAddressEntry> *c)

{
  QNetworkAddressEntry *pQVar1;
  char *pcVar2;
  QTextStream *pQVar3;
  long lVar4;
  undefined8 uVar5;
  storage_type *psVar6;
  storage_type *psVar7;
  QNetworkAddressEntry *pQVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  QNetworkAddressEntry local_78;
  undefined1 local_70 [8];
  QNetworkAddressEntry local_68;
  undefined1 local_60 [8];
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar3 = *(QTextStream **)debug.stream;
  pQVar3[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar7 = (storage_type *)0x0;
  }
  else {
    psVar6 = (storage_type *)0xffffffffffffffff;
    do {
      psVar7 = psVar6 + 1;
      pcVar2 = which + 1 + (long)psVar6;
      psVar6 = psVar7;
    } while (*pcVar2 != '\0');
  }
  QVar9.m_data = psVar7;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar3,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar8 = (c->d).ptr;
  lVar4 = (c->d).size;
  pQVar1 = pQVar8 + lVar4;
  if (lVar4 != 0) {
    local_68.d._M_t.
    super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
    ._M_t.
    super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
    .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl =
         *(unique_ptr<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
           *)debug.stream;
    *(uint *)((long)local_68.d._M_t.
                    super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
                    .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl + 0x28
             ) = *(uint *)((long)local_68.d._M_t.
                                 super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
                                 .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>.
                                 _M_head_impl + 0x28) + 1;
    ::operator<<((Stream *)local_60,&local_68);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug((QDebug *)&local_68);
    pQVar8 = pQVar8 + 1;
  }
  if (pQVar8 != pQVar1) {
    do {
      pQVar3 = *(QTextStream **)debug.stream;
      QVar10.m_data = (storage_type *)0x2;
      QVar10.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<(pQVar3,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      local_78.d._M_t.
      super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
      ._M_t.
      super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
      .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl =
           *(unique_ptr<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
             *)debug.stream;
      *(uint *)((long)local_78.d._M_t.
                      super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
                      .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl +
               0x28) =
           *(uint *)((long)local_78.d._M_t.
                           super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
                           .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl
                    + 0x28) + 1;
      ::operator<<((Stream *)local_70,&local_78);
      QDebug::~QDebug((QDebug *)local_70);
      QDebug::~QDebug((QDebug *)&local_78);
      pQVar8 = pQVar8 + 1;
    } while (pQVar8 != pQVar1);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar5 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar5;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}